

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV1MaterialListBlock(Parser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  uint iMaterialCount;
  int local_348;
  uint local_344;
  ulong local_340;
  string local_338;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *local_318;
  value_type local_310;
  
  local_344 = 0;
  local_318 = &this->m_vMaterials;
  local_340 = (ulong)(uint)((int)((ulong)((long)(this->m_vMaterials).
                                                super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_vMaterials).
                                               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                           -0x1642c859);
  uVar7 = 0;
  local_348 = 0;
LAB_003ff9e4:
  do {
    while( true ) {
      pbVar6 = (byte *)this->filePtr;
      bVar4 = *pbVar6;
      if (bVar4 != 0x2a) break;
      pbVar5 = pbVar6 + 1;
      this->filePtr = (char *)pbVar5;
      iVar2 = strncmp("MATERIAL_COUNT",(char *)pbVar5,0xe);
      if (iVar2 == 0) {
        bVar4 = pbVar6[0xf];
        if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
          this->filePtr = (char *)(pbVar6 + (0x10 - (ulong)(bVar4 == 0)));
          ParseLV4MeshLong(this,&local_344);
          uVar7 = local_344;
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"INVALID","");
          D3DS::Material::Material(&local_310.super_Material,&local_338);
          local_310.super_Material._vptr_Material = (_func_int **)&PTR__Material_0080e978;
          local_310.avSubMaterials.
          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_310.pcInstance = (aiMaterial *)0x0;
          local_310.avSubMaterials.
          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_310.avSubMaterials.
          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_310.bNeed = false;
          std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::resize
                    (local_318,(ulong)((int)local_340 + uVar7),&local_310);
          local_310.super_Material._vptr_Material = (_func_int **)&PTR__Material_0080e978;
          std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector
                    (&local_310.avSubMaterials);
          D3DS::Material::~Material(&local_310.super_Material);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          goto LAB_003ff9e4;
        }
      }
      iVar2 = strncmp("MATERIAL",(char *)pbVar5,8);
      if (iVar2 != 0) {
LAB_003ffbc3:
        bVar4 = *pbVar5;
        pbVar6 = pbVar5;
        goto LAB_003ffbd2;
      }
      bVar4 = pbVar6[9];
      if ((0x20 < (ulong)bVar4) || ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) == 0))
      goto LAB_003ffbc3;
      pbVar5 = pbVar6 + 10;
      if (bVar4 == 0) {
        pbVar5 = pbVar6 + 9;
      }
      this->filePtr = (char *)pbVar5;
      local_310.super_Material._vptr_Material =
           (_func_int **)((ulong)local_310.super_Material._vptr_Material & 0xffffffff00000000);
      ParseLV4MeshLong(this,(uint *)&local_310);
      uVar3 = (uint)local_310.super_Material._vptr_Material;
      if (uVar7 <= (uint)local_310.super_Material._vptr_Material) {
        LogWarning(this,"Out of range: material index is too large");
        uVar3 = uVar7 - 1;
      }
      ParseLV2MaterialBlock
                (this,(this->m_vMaterials).
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start + (uVar3 + (int)local_340));
    }
    if (bVar4 == 0) {
      return;
    }
    if (bVar4 == 0x7b) {
      local_348 = local_348 + 1;
LAB_003ffbcb:
      bVar1 = false;
    }
    else {
      if (bVar4 == 0x7d) {
        local_348 = local_348 + -1;
        if (local_348 == 0) {
          this->filePtr = (char *)(pbVar6 + 1);
          SkipToNextToken(this);
          return;
        }
        goto LAB_003ffbcb;
      }
LAB_003ffbd2:
      bVar1 = false;
      if ((bVar4 < 0xe) && ((0x3401U >> (bVar4 & 0x1f) & 1) != 0)) {
        if (this->bLastWasEndLine == false) {
          this->iLineNumber = this->iLineNumber + 1;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(pbVar6 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV1MaterialListBlock()
{
    AI_ASE_PARSER_INIT();

    unsigned int iMaterialCount = 0;
    unsigned int iOldMaterialCount = (unsigned int)m_vMaterials.size();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"MATERIAL_COUNT",14))
            {
                ParseLV4MeshLong(iMaterialCount);

                // now allocate enough storage to hold all materials
                m_vMaterials.resize(iOldMaterialCount+iMaterialCount, Material("INVALID"));
                continue;
            }
            if (TokenMatch(filePtr,"MATERIAL",8))
            {
                unsigned int iIndex = 0;
                ParseLV4MeshLong(iIndex);

                if (iIndex >= iMaterialCount)
                {
                    LogWarning("Out of range: material index is too large");
                    iIndex = iMaterialCount-1;
                }

                // get a reference to the material
                Material& sMat = m_vMaterials[iIndex+iOldMaterialCount];
                // parse the material block
                ParseLV2MaterialBlock(sMat);
                continue;
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
}